

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void __thiscall llvm::APInt::initSlowCase(APInt *this,uint64_t val,bool isSigned)

{
  uint uVar1;
  uint64_t *puVar2;
  uint i;
  ulong uVar3;
  
  puVar2 = getClearedMemory((uint)((ulong)this->BitWidth + 0x3f >> 6));
  (this->U).pVal = puVar2;
  *puVar2 = val;
  if ((long)val < 0 && isSigned) {
    uVar1 = this->BitWidth;
    for (uVar3 = 1; uVar3 < (ulong)uVar1 + 0x3f >> 6; uVar3 = uVar3 + 1) {
      (this->U).pVal[uVar3] = 0xffffffffffffffff;
    }
  }
  clearUnusedBits(this);
  return;
}

Assistant:

void APInt::initSlowCase(uint64_t val, bool isSigned) {
  U.pVal = getClearedMemory(getNumWords());
  U.pVal[0] = val;
  if (isSigned && int64_t(val) < 0)
    for (unsigned i = 1; i < getNumWords(); ++i)
      U.pVal[i] = WORD_MAX;
  clearUnusedBits();
}